

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O3

int oneBitPosition(int x,int size)

{
  uint uVar1;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      if (((uint)x >> (uVar1 & 0x1f) & 1) != 0) {
        return uVar1;
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  return -1;
}

Assistant:

int oneBitPosition(int x, int size)
{
	int i;
	for(i=0;i<size;i++)
		if((x>>i)&1)
			return i;
	return -1;
}